

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_alpn_list_contains_protocol
               (Span<const_unsigned_char> list,Span<const_unsigned_char> protocol)

{
  Span<const_unsigned_char> rhs;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Span<const_unsigned_char> lhs;
  undefined1 local_60 [8];
  CBS candidate;
  undefined1 local_40 [8];
  CBS cbs;
  Span<const_unsigned_char> protocol_local;
  Span<const_unsigned_char> list_local;
  
  candidate.len = (size_t)list.data_;
  cbs.len = (size_t)protocol.data_;
  cbs_st::cbs_st((cbs_st *)local_40,list);
  while( true ) {
    sVar3 = CBS_len((CBS *)local_40);
    if (sVar3 == 0) {
      return false;
    }
    iVar2 = CBS_get_u8_length_prefixed((CBS *)local_40,(CBS *)local_60);
    if (iVar2 == 0) break;
    lhs = cbs_st::operator_cast_to_Span((cbs_st *)local_60);
    rhs.size_ = protocol.size_;
    rhs.data_ = (uchar *)cbs.len;
    bVar1 = internal::operator==(lhs,rhs);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ssl_alpn_list_contains_protocol(Span<const uint8_t> list,
                                     Span<const uint8_t> protocol) {
  CBS cbs = list, candidate;
  while (CBS_len(&cbs) > 0) {
    if (!CBS_get_u8_length_prefixed(&cbs, &candidate)) {
      return false;
    }

    if (candidate == protocol) {
      return true;
    }
  }

  return false;
}